

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sensors.cpp
# Opt level: O2

int SensorBase::detect_sensor(string *type)

{
  __type _Var1;
  path *ppVar2;
  size_type sVar3;
  _Alloc_hider __nptr;
  bool bVar4;
  int local_14c;
  directory_iterator local_148;
  directory_iterator __end1;
  __shared_ptr<std::filesystem::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2> local_120;
  path name_path;
  __shared_ptr<std::filesystem::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2> local_e8;
  string es;
  __shared_ptr<std::filesystem::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2> local_b0;
  path sysfsbasepath;
  path local_78;
  string local_50;
  
  std::filesystem::__cxx11::path::path<char[32],std::filesystem::__cxx11::path>
            (&name_path,(char (*) [32])"/sys/bus/iio/devices/iio:device",auto_format);
  ppVar2 = (path *)std::filesystem::__cxx11::path::remove_filename();
  std::filesystem::__cxx11::path::path(&sysfsbasepath,ppVar2);
  std::filesystem::__cxx11::path::~path(&name_path);
  std::filesystem::__cxx11::directory_iterator::directory_iterator
            ((directory_iterator *)&local_120,&sysfsbasepath);
  std::__shared_ptr<std::filesystem::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_e8,&local_120);
  local_148._M_dir._M_ptr = local_e8._M_ptr;
  local_148._M_dir._M_refcount._M_pi = local_e8._M_refcount._M_pi;
  local_e8._M_ptr = (element_type *)0x0;
  local_e8._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_e8._M_refcount);
  std::__shared_ptr<std::filesystem::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_b0,&local_120);
  __end1._M_dir._M_ptr = (element_type *)0x0;
  __end1._M_dir._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b0._M_refcount);
  while (local_148._M_dir._M_refcount._M_pi != __end1._M_dir._M_refcount._M_pi) {
    ppVar2 = (path *)std::filesystem::__cxx11::directory_iterator::operator*(&local_148);
    std::filesystem::__cxx11::path::path<char[5],std::filesystem::__cxx11::path>
              (&local_78,(char (*) [5])"name",auto_format);
    std::filesystem::__cxx11::operator/(&name_path,ppVar2,&local_78);
    std::filesystem::__cxx11::path::~path(&local_78);
    readstr_abi_cxx11_(&local_50,name_path._M_pathname._M_dataplus._M_p,0x100);
    trim(&local_78._M_pathname,&local_50);
    _Var1 = std::operator==(&local_78._M_pathname,type);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_50);
    if (_Var1) {
      std::filesystem::__cxx11::path::filename(&local_78,ppVar2);
      std::filesystem::__cxx11::path::string(&es,&local_78);
      std::filesystem::__cxx11::path::~path(&local_78);
      sVar3 = es._M_string_length;
      __nptr = es._M_dataplus;
      while (bVar4 = sVar3 != 0, sVar3 = sVar3 - 1, bVar4) {
        if (0xf5 < (byte)(*__nptr._M_p - 0x3aU)) {
          local_14c = atoi(__nptr._M_p);
          goto LAB_0010f7f7;
        }
        __nptr._M_p = __nptr._M_p + 1;
      }
      local_14c = -1;
LAB_0010f7f7:
      std::__cxx11::string::~string((string *)&es);
    }
    std::filesystem::__cxx11::path::~path(&name_path);
    if (_Var1) goto LAB_0010f82b;
    std::filesystem::__cxx11::directory_iterator::operator++(&local_148);
  }
  local_14c = -1;
LAB_0010f82b:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&__end1._M_dir._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_148._M_dir._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_120._M_refcount);
  std::filesystem::__cxx11::path::~path(&sysfsbasepath);
  return local_14c;
}

Assistant:

int SensorBase::detect_sensor(std::string type)
{
	using filesystem::path;
	path sysfsbasepath=path(IIODEV_SYSFS_PATH_BASE).remove_filename();
	for(auto& ent:filesystem::directory_iterator(sysfsbasepath))
	{
		path name_path=ent.path()/"name";
		if(trim(readstr(name_path.c_str()))==type)
		{
			std::string es=ent.path().filename().string();
			size_t i;
			for(i=0;i<es.length()&&(es[i]<'0'||es[i]>'9');++i);
			if(i<es.length())return atoi(es.c_str()+i);
			return -1;
		}
	}
	return -1;
}